

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

void __thiscall RealTrafficConnection::RealTrafficConnection(RealTrafficConnection *this)

{
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  TCPConnection *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  WxTy *in_stack_ffffffffffffffc0;
  
  LTFlightDataChannel::LTFlightDataChannel
            ((LTFlightDataChannel *)in_stack_ffffffffffffffc0,
             (dataRefsLT)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             (char *)in_stack_ffffffffffffffb0,
             (LTChannelType)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  *in_RDI = &PTR__RealTrafficConnection_0046d5c0;
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x21a8e4);
  *(undefined4 *)(in_RDI + 0x42) = 0;
  *(undefined4 *)((long)in_RDI + 0x214) = 0;
  *(undefined4 *)(in_RDI + 0x43) = 0;
  CurrTy::CurrTy((CurrTy *)in_stack_ffffffffffffffc0);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffb0);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffb0);
  WxTy::WxTy(in_stack_ffffffffffffffc0);
  in_RDI[0xec] = 0xffffffffffffffff;
  *(undefined1 *)(in_RDI + 0xed) = 0;
  std::thread::thread((thread *)0x21a980);
  XPMP2::TCPConnection::TCPConnection(in_stack_ffffffffffffffb0);
  *(undefined4 *)(in_RDI + 0xfb) = 0;
  XPMP2::UDPReceiver::UDPReceiver((UDPReceiver *)in_stack_ffffffffffffffb0);
  *(undefined4 *)(in_RDI + 0x104) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x824) = 0xffffffff;
  in_RDI[0x105] = 0;
  std::
  map<unsigned_long,_RTUDPDatagramTy,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_RTUDPDatagramTy>_>_>
  ::map((map<unsigned_long,_RTUDPDatagramTy,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_RTUDPDatagramTy>_>_>
         *)0x21a9ee);
  std::deque<double,_std::allocator<double>_>::deque
            ((deque<double,_std::allocator<double>_> *)0x21aa04);
  in_RDI[0x116] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 5),anon_var_dwarf_301ccb + 4);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"https://rtweb.flyrealtraffic.com/");
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 9),
             "Open RealTraffic\'s web site, which has a traffic status overview");
  return;
}

Assistant:

RealTrafficConnection::RealTrafficConnection () :
LTFlightDataChannel(DR_CHANNEL_REAL_TRAFFIC_ONLINE, REALTRAFFIC_NAME)
{
    //purely information
    urlName  = RT_CHECK_NAME;
    urlLink  = RT_CHECK_URL;
    urlPopup = RT_CHECK_POPUP;
}